

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<7,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  float scalar;
  Matrix<float,_1,_2> blockC;
  Matrix<float,_2,_1> matB;
  Matrix<float,_1,_2> matC;
  Matrix<float,_2,_2> invA;
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_1> blockB;
  Type in0;
  Matrix<float,_2,_2> zeroMat;
  float nullField [4];
  float areaC [2];
  float areaA [4];
  Matrix<float,_2,_1> local_150;
  undefined1 local_148 [16];
  Matrix<float,_2,_1> local_138;
  Matrix<float,_1,_2> local_130;
  Matrix<float,_2,_2> local_128;
  tcu local_118 [4];
  int local_114;
  Matrix<float,_2,_2> local_108;
  undefined1 local_f8 [16];
  int local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  Mat3 local_d4;
  Matrix<float,_2,_1> local_b0;
  Matrix<float,_2,_2> local_a8;
  float local_98 [7];
  float local_7c;
  float local_78;
  MatrixCaseUtils local_74 [12];
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  Matrix<float,_3,_3> local_4c;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              (&local_d4,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix(&local_d4,(float *)sr::(anonymous_namespace)::s_constInMat3x3);
  }
  local_68 = local_d4.m_data.m_data[0].m_data[0];
  local_64 = local_d4.m_data.m_data[1].m_data[0];
  local_60 = local_d4.m_data.m_data[0].m_data[1];
  local_5c = local_d4.m_data.m_data[1].m_data[1];
  local_98[4] = local_d4.m_data.m_data[2].m_data[0];
  local_98[5] = local_d4.m_data.m_data[2].m_data[1];
  local_7c = local_d4.m_data.m_data[0].m_data[2];
  local_78 = local_d4.m_data.m_data[1].m_data[2];
  local_148._0_4_ = local_d4.m_data.m_data[2].m_data[2];
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)local_f8,&local_68);
  inverse<2>((MatrixCaseUtils *)&local_128,(Matrix<float,_2,_2> *)local_f8);
  tcu::Matrix<float,_2,_1>::Matrix(&local_138,local_98 + 4);
  tcu::Matrix<float,_1,_2>::Matrix(&local_130,&local_7c);
  tcu::operator*((tcu *)local_f8,&local_130,&local_128);
  tcu::operator*((Matrix<float,_1,_2> *)local_f8,&local_138);
  local_148._0_4_ = (float)local_148._0_4_ - local_a8.m_data.m_data[0].m_data[0];
  tcu::Matrix<float,_2,_2>::Matrix(&local_a8,local_98);
  tcu::operator*((tcu *)&local_b0,&local_128,&local_138);
  scalar = 1.0 / (float)local_148._0_4_;
  local_148 = ZEXT416((uint)scalar);
  tcu::operator*((tcu *)&local_150,&local_b0,scalar);
  tcu::operator*((tcu *)&local_108,&local_150,&local_130);
  tcu::operator*((tcu *)local_f8,&local_108,&local_128);
  tcu::operator+(local_118,&local_128,(Matrix<float,_2,_2> *)local_f8);
  tcu::operator-((tcu *)local_f8,&local_a8,&local_128);
  tcu::operator*((tcu *)&local_150,(Matrix<float,_2,_2> *)local_f8,&local_138);
  tcu::operator*((tcu *)&local_108,&local_150,(float)local_148._0_4_);
  tcu::operator*((tcu *)local_f8,&local_130,&local_128);
  tcu::operator*((tcu *)&local_150,(Matrix<float,_1,_2> *)local_f8,-(float)local_148._0_4_);
  fStack_e0 = local_150.m_data.m_data[0].m_data[0];
  fStack_dc = local_150.m_data.m_data[0].m_data[1];
  local_e8 = local_114;
  fStack_e4 = local_108.m_data.m_data[0].m_data[1];
  local_d8 = local_148._0_4_;
  tcu::Matrix<float,_3,_3>::Matrix(&local_4c,(float *)local_f8);
  reduceToVec3(local_74,&local_4c);
  local_f8._0_8_ = &evalCtx->color;
  local_f8._8_4_ = 0.0;
  local_f8._12_4_ = 1.4013e-45;
  local_e8 = 2;
  tcu::VecAccess<float,_4,_3>::operator=
            ((VecAccess<float,_4,_3> *)local_f8,(Vector<float,_3> *)local_74);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(inverse(in0));
	}